

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

void __thiscall sf::priv::JoystickImpl::JoystickImpl(JoystickImpl *this)

{
  JoystickState *in_RDI;
  JoystickState *__last;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  *(undefined4 *)in_RDI = 0xffffffff;
  JoystickState::JoystickState(in_RDI);
  __last = in_RDI + 2;
  Joystick::Identification::Identification
            ((Identification *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  std::fill<char*,int>(&in_RDI->connected,&__last->connected,(int *)0x19798c);
  return;
}

Assistant:

JoystickImpl::JoystickImpl() :
m_file(-1)
{
    std::fill(m_mapping, m_mapping + ABS_MAX + 1, 0);
}